

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLURL::buildFullText(XMLURL *this)

{
  uint toFormat;
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  XMLCh tmpBuf [17];
  XMLCh *pXVar8;
  
  XVar2 = XMLString::stringLen(this->fFragment);
  XVar3 = XMLString::stringLen(this->fHost);
  XVar4 = XMLString::stringLen(this->fPassword);
  XVar5 = XMLString::stringLen(this->fPath);
  XVar6 = XMLString::stringLen(this->fQuery);
  XVar7 = XMLString::stringLen(this->fUser);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURLText);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(XVar7 + XVar6 + XVar5 + XVar4 + XVar3 + XVar2) * 2 + 0x58
                    );
  pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  this->fURLText = pXVar8;
  *pXVar8 = L'\0';
  if (this->fProtocol != Unknown) {
    pXVar9 = getProtocolName(this);
    XMLString::catString(pXVar8,pXVar9);
    XVar2 = XMLString::stringLen(this->fURLText);
    (pXVar8 + XVar2)[0] = L':';
    (pXVar8 + XVar2)[1] = L'/';
    pXVar8[XVar2 + 2] = L'/';
    pXVar8 = pXVar8 + XVar2 + 3;
  }
  if (this->fUser != (XMLCh *)0x0) {
    XMLString::copyString(pXVar8,this->fUser);
    XVar2 = XMLString::stringLen(this->fUser);
    pXVar8 = pXVar8 + XVar2;
    pXVar9 = this->fPassword;
    if (pXVar9 != (XMLCh *)0x0) {
      *pXVar8 = L':';
      XMLString::copyString(pXVar8 + 1,pXVar9);
      XVar2 = XMLString::stringLen(this->fPassword);
      pXVar8 = pXVar8 + XVar2 + 1;
    }
    *pXVar8 = L'@';
    pXVar8 = pXVar8 + 1;
  }
  if (this->fHost != (XMLCh *)0x0) {
    XMLString::copyString(pXVar8,this->fHost);
    XVar2 = XMLString::stringLen(this->fHost);
    pXVar8 = pXVar8 + XVar2;
    toFormat = this->fPortNum;
    if (toFormat != 0) {
      *pXVar8 = L':';
      XMLString::binToText(toFormat,tmpBuf,0x10,10,this->fMemoryManager);
      XMLString::copyString(pXVar8 + 1,tmpBuf);
      XVar2 = XMLString::stringLen(tmpBuf);
      pXVar8 = pXVar8 + XVar2 + 1;
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(pXVar8,this->fPath);
    XVar2 = XMLString::stringLen(this->fPath);
    pXVar8 = pXVar8 + XVar2;
  }
  pXVar9 = this->fQuery;
  if (pXVar9 != (XMLCh *)0x0) {
    *pXVar8 = L'?';
    XMLString::copyString(pXVar8 + 1,pXVar9);
    XVar2 = XMLString::stringLen(this->fQuery);
    pXVar8 = pXVar8 + XVar2 + 1;
  }
  pXVar9 = this->fFragment;
  if (pXVar9 != (XMLCh *)0x0) {
    *pXVar8 = L'#';
    XMLString::copyString(pXVar8 + 1,pXVar9);
    XVar2 = XMLString::stringLen(this->fFragment);
    pXVar8 = pXVar8 + XVar2 + 1;
  }
  *pXVar8 = L'\0';
  return;
}

Assistant:

void XMLURL::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = gMaxProtoLen + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost) + 2
                           + XMLString::stringLen(fPassword) + 1
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQuery) + 1
                           + XMLString::stringLen(fUser) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURLText);//delete [] fURLText;
    fURLText = (XMLCh*) fMemoryManager->allocate((bufSize) * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURLText = 0;

    XMLCh* outPtr = fURLText;
    if (fProtocol != Unknown)
    {
        XMLString::catString(fURLText, getProtocolName());
        outPtr += XMLString::stringLen(fURLText);
        *outPtr++ = chColon;
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;
    }

    if (fUser)
    {
        XMLString::copyString(outPtr, fUser);
        outPtr += XMLString::stringLen(fUser);

        if (fPassword)
        {
            *outPtr++ = chColon;
            XMLString::copyString(outPtr, fPassword);
            outPtr += XMLString::stringLen(fPassword);
        }

        *outPtr++ = chAt;
    }

    if (fHost)
    {
        XMLString::copyString(outPtr, fHost);
        outPtr += XMLString::stringLen(fHost);

        //
        //  If the port is zero, then we don't put it in. Else we need
        //  to because it was explicitly provided.
        //
        if (fPortNum)
        {
            *outPtr++ = chColon;

            XMLCh tmpBuf[17];
            XMLString::binToText(fPortNum, tmpBuf, 16, 10, fMemoryManager);
            XMLString::copyString(outPtr, tmpBuf);
            outPtr += XMLString::stringLen(tmpBuf);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQuery)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQuery);
        outPtr += XMLString::stringLen(fQuery);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}